

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::WaitOrderStatementSyntax::setChild
          (WaitOrderStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0050ba8c + *(int *)(&DAT_0050ba8c + index * 4)))();
  return;
}

Assistant:

void WaitOrderStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: wait_order = child.token(); return;
        case 3: openParen = child.token(); return;
        case 4: names = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        case 5: closeParen = child.token(); return;
        case 6: action = child.node() ? &child.node()->as<ActionBlockSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}